

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O2

void luv2xyz(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = in_out->a;
  if (1e-08 < dVar1) {
    dVar3 = in_out->b / (dVar1 * 13.0) + 0.19783000664283681;
    dVar2 = in_out->c / (dVar1 * 13.0) + 0.468319994938791;
    if (dVar1 <= 8.0) {
      dVar1 = dVar1 / 903.2962962962963;
    }
    else {
      dVar1 = (dVar1 + 16.0) / 116.0;
      dVar1 = dVar1 * dVar1 * dVar1;
    }
    dVar3 = (dVar1 * -9.0 * dVar3) / ((dVar3 + -4.0) * dVar2 - dVar2 * dVar3);
    in_out->a = dVar3;
    in_out->b = dVar1;
    in_out->c = ((dVar1 * 9.0 + dVar2 * -15.0 * dVar1) - dVar2 * dVar3) / (dVar2 * 3.0);
    return;
  }
  in_out->a = 0.0;
  in_out->b = 0.0;
  in_out->c = 0.0;
  return;
}

Assistant:

static void
luv2xyz(Triplet* in_out)
{
    if(in_out->a <= 0.00000001) {
        /* Black will create a divide-by-zero error. */
        in_out->a = 0.0;
        in_out->b = 0.0;
        in_out->c = 0.0;
        return;
    }

    double var_u = in_out->b / (13.0 * in_out->a) + ref_u;
    double var_v = in_out->c / (13.0 * in_out->a) + ref_v;
    double y = l2y(in_out->a);
    double x = -(9.0 * y * var_u) / ((var_u - 4.0) * var_v - var_u * var_v);
    double z = (9.0 * y - (15.0 * var_v * y) - (var_v * x)) / (3.0 * var_v);
    in_out->a = x;
    in_out->b = y;
    in_out->c = z;
}